

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_error_addrinuse_listen(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b_1;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_tcp_t server2;
  uv_tcp_t server1;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_b_1 = (int64_t)iVar1;
  server2.data = (void *)0x0;
  server1.data = (void *)eval_b_1;
  if ((void *)eval_b_1 == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&server1);
    server2.data = (void *)(long)iVar1;
    if (server2.data == (void *)0x0) {
      iVar1 = uv_tcp_bind(&server1,(sockaddr *)&addr,0);
      server2.data = (void *)(long)iVar1;
      if (server2.data == (void *)0x0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_tcp_init(puVar2,&server2);
        eval_b_1 = (int64_t)iVar1;
        eval_b_3 = 0;
        if ((void *)eval_b_1 == (void *)0x0) {
          iVar1 = uv_tcp_bind(&server2,(sockaddr *)&addr,0);
          eval_b_1 = (int64_t)iVar1;
          eval_b_3 = 0;
          if ((void *)eval_b_1 == (void *)0x0) {
            iVar1 = uv_listen((uv_stream_t *)&server1,0x80,(uv_connection_cb)0x0);
            eval_b_1 = (int64_t)iVar1;
            eval_b_3 = 0;
            if ((void *)eval_b_1 == (void *)0x0) {
              iVar1 = uv_listen((uv_stream_t *)&server2,0x80,(uv_connection_cb)0x0);
              eval_b_1 = (int64_t)iVar1;
              eval_b_3 = -0x62;
              if ((void *)eval_b_1 == (void *)0xffffffffffffff9e) {
                uv_close((uv_handle_t *)&server1,close_cb);
                uv_close((uv_handle_t *)&server2,close_cb);
                puVar2 = uv_default_loop();
                uv_run(puVar2,UV_RUN_DEFAULT);
                eval_b_1 = 2;
                eval_b_3 = (int64_t)close_cb_called;
                if (eval_b_3 == 2) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  eval_b_1 = 0;
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  eval_b_3 = (int64_t)iVar1;
                  if (eval_b_3 == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar4 = "uv_loop_close(uv_default_loop())";
                  pcVar3 = "0";
                  uVar5 = 0x6c;
                }
                else {
                  pcVar4 = "close_cb_called";
                  pcVar3 = "2";
                  uVar5 = 0x6a;
                }
              }
              else {
                pcVar4 = "UV_EADDRINUSE";
                pcVar3 = "r";
                uVar5 = 99;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar5 = 0x61;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar5 = 0x5e;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x5c;
        }
        goto LAB_0017d721;
      }
      uVar5 = 0x59;
    }
    else {
      uVar5 = 0x57;
    }
    pcVar4 = "0";
    pcVar3 = "r";
    eval_b_3 = 0;
    eval_b_1 = (int64_t)server2.data;
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar5 = 0x55;
    eval_b_3 = 0;
  }
LAB_0017d721:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_b_1,"==",eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_error_addrinuse_listen) {
  struct sockaddr_in addr;
  uv_tcp_t server1, server2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT_EQ(r, UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}